

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmLocalGenerator::ExpandCustomCommandOutputPaths
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmCompiledGeneratorExpression *cge,
          string *config)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  string *psVar2;
  reference in_path;
  container_type *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  string local_e8;
  reference local_c8;
  string *p;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  cmList paths;
  string *config_local;
  cmCompiledGeneratorExpression *cge_local;
  cmLocalGenerator *this_local;
  
  local_78 = &local_70;
  paths.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = config;
  std::__cxx11::string::string((string *)&local_98);
  psVar2 = cmCompiledGeneratorExpression::Evaluate
                     (cge,this,config,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_98);
  std::__cxx11::string::string((string *)&local_70,(string *)psVar2);
  local_50 = &local_70;
  local_48 = 1;
  init._M_len = 1;
  init._M_array = local_50;
  cmList::cmList((cmList *)local_40,init);
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
  do {
    local_128 = local_128 + -1;
    std::__cxx11::string::~string((string *)local_128);
  } while (local_128 != &local_70);
  std::__cxx11::string::~string((string *)&local_98);
  __end1 = cmList::begin_abi_cxx11_((cmList *)local_40);
  p = (string *)cmList::end_abi_cxx11_((cmList *)local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&p);
    if (!bVar1) break;
    in_path = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
    local_c8 = in_path;
    psVar2 = GetCurrentBinaryDirectory_abi_cxx11_(this);
    cmsys::SystemTools::CollapseFullPath(&local_e8,in_path,psVar2);
    std::__cxx11::string::operator=((string *)local_c8,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pcVar3 = cmList::data_abi_cxx11_((cmList *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,pcVar3);
  cmList::~cmList((cmList *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmLocalGenerator::ExpandCustomCommandOutputPaths(
  cmCompiledGeneratorExpression const& cge, std::string const& config)
{
  cmList paths{ cge.Evaluate(this, config) };
  for (std::string& p : paths) {
    p = cmSystemTools::CollapseFullPath(p, this->GetCurrentBinaryDirectory());
  }
  return std::move(paths.data());
}